

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O2

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double *pdVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double local_c0;
  
  lVar18 = N_VGetArrayPointer();
  lVar19 = N_VGetArrayPointer();
  pdVar17 = *user_data;
  dVar3 = *pdVar17;
  dVar4 = pdVar17[1];
  dVar5 = pdVar17[2];
  dVar6 = pdVar17[3];
  dVar7 = pdVar17[4];
  dVar29 = sin(t * *(double *)((long)user_data + 0x1528));
  local_c0 = 0.0;
  dVar34 = 0.0;
  if (0.0 < dVar29) {
    dVar34 = exp(-dVar6 / dVar29);
    local_c0 = exp(-dVar7 / dVar29);
  }
  *(double *)((long)user_data + 0x1520) = local_c0;
  dVar6 = *(double *)((long)user_data + 0x1538);
  dVar7 = *(double *)((long)user_data + 0x1540);
  dVar29 = *(double *)((long)user_data + 0x1550);
  dVar8 = *(double *)((long)user_data + 0x1548);
  dVar34 = dVar34 * dVar5;
  lVar1 = lVar18 + 8;
  lVar19 = lVar19 + 8;
  lVar28 = lVar1;
  for (lVar22 = 0; lVar22 != 0xf; lVar22 = lVar22 + 1) {
    dVar30 = ((double)(int)lVar22 + -0.5) * dVar6 + 30.0;
    dVar31 = exp(dVar30 * 0.2);
    dVar30 = exp((dVar6 + dVar30) * 0.2);
    dVar30 = dVar30 * dVar29;
    lVar20 = 0xffffffff;
    if (lVar22 == 0) {
      lVar20 = 1;
    }
    lVar21 = 1;
    if (lVar22 == 0xe) {
      lVar21 = 0xffffffff;
    }
    dVar31 = dVar31 * -dVar29;
    lVar2 = lVar18 + lVar22 * 0xf0;
    lVar23 = lVar22 * 0xf0 + lVar18 + 8;
    lVar21 = ((lVar21 + lVar22) * 0x1e00000000 >> 0x1d) + lVar1;
    lVar20 = ((lVar20 + lVar22) * 0x1e00000000 >> 0x1d) + lVar1;
    iVar24 = 0;
    for (lVar25 = 0; lVar25 != 0xf0; lVar25 = lVar25 + 0x10) {
      dVar9 = *(double *)(lVar28 + -8 + lVar25);
      dVar10 = *(double *)(lVar28 + lVar25);
      dVar32 = dVar3 * dVar9 * dVar5;
      dVar33 = dVar4 * dVar9 * dVar10;
      dVar11 = *(double *)(lVar21 + lVar25);
      dVar12 = *(double *)(lVar20 + lVar25);
      lVar26 = (long)(int)(((-(uint)(lVar25 != 0) | 1) + iVar24) * 2);
      dVar13 = *(double *)(lVar2 + lVar26 * 8);
      lVar27 = (long)(int)((iVar24 + (uint)(lVar25 != 0xe0) * 2) * 2 + -2);
      dVar14 = *(double *)(lVar2 + lVar27 * 8);
      dVar15 = *(double *)(lVar23 + lVar27 * 8);
      dVar16 = *(double *)(lVar23 + lVar26 * 8);
      *(double *)(lVar19 + -8 + lVar25) =
           (dVar14 - dVar13) * dVar8 +
           ((dVar14 - (dVar9 + dVar9)) + dVar13) * dVar7 +
           (*(double *)(lVar21 + -8 + lVar25) - dVar9) * dVar30 +
           (dVar9 - *(double *)(lVar20 + -8 + lVar25)) * dVar31 +
           (-dVar32 - dVar33) + dVar34 + dVar34 + local_c0 * dVar10;
      *(double *)(lVar19 + lVar25) =
           (dVar15 - dVar16) * dVar8 +
           ((dVar15 - (dVar10 + dVar10)) + dVar16) * dVar7 +
           (dVar11 - dVar10) * dVar30 + (dVar10 - dVar12) * dVar31 +
           ((dVar32 - dVar33) - local_c0 * dVar10);
      iVar24 = iVar24 + 1;
    }
    lVar19 = lVar19 + 0xf0;
    lVar28 = lVar28 + 0xf0;
  }
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype q3, c1, c2, c1dn, c2dn, c1up, c2up, c1lt, c2lt;
  sunrealtype c1rt, c2rt, czdn, czup, hord1, hord2, horad1, horad2;
  sunrealtype qq1, qq2, qq3, qq4, rkin1, rkin2, s, vertd1, vertd2, zdn, zup;
  sunrealtype q4coef, delz, verdco, hordco, horaco;
  sunrealtype *ydata, *dydata;
  int jx, jz, idn, iup, ileft, iright;
  UserData data;
  sunrealtype Q1, Q2, C3, A3, A4;

  data   = (UserData)user_data;
  ydata  = N_VGetArrayPointer(y);
  dydata = N_VGetArrayPointer(ydot);

  /* Load problem coefficients and parameters */

  Q1 = data->p[0];
  Q2 = data->p[1];
  C3 = data->p[2];
  A3 = data->p[3];
  A4 = data->p[4];

  /* Set diurnal rate coefficients. */

  s = sin(data->om * t);
  if (s > ZERO)
  {
    q3       = exp(-A3 / s);
    data->q4 = exp(-A4 / s);
  }
  else
  {
    q3       = ZERO;
    data->q4 = ZERO;
  }

  /* Make local copies of problem variables, for efficiency. */

  q4coef = data->q4;
  delz   = data->dz;
  verdco = data->vdco;
  hordco = data->hdco;
  horaco = data->haco;

  /* Loop over all grid points. */

  for (jz = 0; jz < MZ; jz++)
  {
    /* Set vertical diffusion coefficients at jz +- 1/2 */

    zdn  = ZMIN + (jz - SUN_RCONST(0.5)) * delz;
    zup  = zdn + delz;
    czdn = verdco * exp(SUN_RCONST(0.2) * zdn);
    czup = verdco * exp(SUN_RCONST(0.2) * zup);
    idn  = (jz == 0) ? 1 : -1;
    iup  = (jz == MZ - 1) ? -1 : 1;
    for (jx = 0; jx < MX; jx++)
    {
      /* Extract c1 and c2, and set kinetic rate terms. */

      c1    = IJKth(ydata, 1, jx, jz);
      c2    = IJKth(ydata, 2, jx, jz);
      qq1   = Q1 * c1 * C3;
      qq2   = Q2 * c1 * c2;
      qq3   = q3 * C3;
      qq4   = q4coef * c2;
      rkin1 = -qq1 - qq2 + SUN_RCONST(2.0) * qq3 + qq4;
      rkin2 = qq1 - qq2 - qq4;

      /* Set vertical diffusion terms. */

      c1dn   = IJKth(ydata, 1, jx, jz + idn);
      c2dn   = IJKth(ydata, 2, jx, jz + idn);
      c1up   = IJKth(ydata, 1, jx, jz + iup);
      c2up   = IJKth(ydata, 2, jx, jz + iup);
      vertd1 = czup * (c1up - c1) - czdn * (c1 - c1dn);
      vertd2 = czup * (c2up - c2) - czdn * (c2 - c2dn);

      /* Set horizontal diffusion and advection terms. */

      ileft  = (jx == 0) ? 1 : -1;
      iright = (jx == MX - 1) ? -1 : 1;
      c1lt   = IJKth(ydata, 1, jx + ileft, jz);
      c2lt   = IJKth(ydata, 2, jx + ileft, jz);
      c1rt   = IJKth(ydata, 1, jx + iright, jz);
      c2rt   = IJKth(ydata, 2, jx + iright, jz);
      hord1  = hordco * (c1rt - SUN_RCONST(2.0) * c1 + c1lt);
      hord2  = hordco * (c2rt - SUN_RCONST(2.0) * c2 + c2lt);
      horad1 = horaco * (c1rt - c1lt);
      horad2 = horaco * (c2rt - c2lt);

      /* Load all terms into ydot. */

      IJKth(dydata, 1, jx, jz) = vertd1 + hord1 + horad1 + rkin1;
      IJKth(dydata, 2, jx, jz) = vertd2 + hord2 + horad2 + rkin2;
    }
  }

  return (0);
}